

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O3

void __thiscall bwtil::cw_bwt::computeEmpiricalEntropy(cw_bwt *this)

{
  uint uVar1;
  ulint uVar2;
  pointer pvVar3;
  pointer puVar4;
  unsigned_long uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulint uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var [56];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  double dVar18;
  undefined1 auVar20 [64];
  undefined1 in_XMM5 [16];
  
  this->Hk = 0.0;
  uVar2 = this->number_of_contexts;
  if (uVar2 != 0) {
    auVar7 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this->n);
    uVar10 = 0;
    pvVar3 = (this->frequencies).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = this->sigma;
    auVar14 = ZEXT1664(ZEXT816(0));
    do {
      uVar5 = puVar4[uVar10];
      if (uVar5 != 0) {
        if ((ulong)uVar1 == 0) {
          auVar8 = vcvtusi2sd_avx512f(in_XMM5,uVar5);
          dVar15 = auVar8._0_8_;
          dVar18 = 0.0;
        }
        else {
          auVar8 = vcvtusi2sd_avx512f(in_XMM5,uVar5);
          auVar17 = ZEXT1664(auVar8);
          auVar20 = ZEXT1664(ZEXT816(0));
          uVar11 = 0;
          lVar6 = *(long *)&pvVar3[uVar10].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data;
          uVar12 = (long)*(pointer *)
                          ((long)&pvVar3[uVar10].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar6 >> 3;
          do {
            auVar19._0_8_ = auVar20._0_8_;
            if (uVar12 == uVar11) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar12,uVar12);
            }
            auVar9 = vcvtusi2sd_avx512f(in_XMM5,*(undefined8 *)(lVar6 + uVar11 * 8));
            dVar15 = auVar9._0_8_ * (1.0 / auVar8._0_8_);
            if (0.0 < dVar15) {
              auVar20._0_8_ = log2(dVar15);
              auVar20._8_56_ = extraout_var;
              auVar19._8_8_ = 0;
              auVar17 = ZEXT864((ulong)auVar8._0_8_);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = dVar15;
              auVar19 = vfnmadd231sd_fma(auVar19,auVar20._0_16_,auVar9);
              auVar20 = ZEXT1664(auVar19);
            }
            dVar18 = auVar20._0_8_;
            dVar15 = auVar17._0_8_;
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        auVar16._8_8_ = 0;
        auVar16._0_8_ = auVar14._0_8_;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = 1.0 / auVar7._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar18 * dVar15;
        auVar8 = vfmadd231sd_fma(auVar16,auVar13,auVar8);
        auVar14 = ZEXT1664(auVar8);
        this->Hk = auVar8._0_8_;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar2);
  }
  return;
}

Assistant:

void computeEmpiricalEntropy(){

		//warning:to be called AFTER initialization of structures

		Hk = 0;//k-order empirical entropy

		for(ulint i=0;i<number_of_contexts;i++){//for each non-empty context

			if(lengths[i]>0){

				double H0=0;//0-order entropy of this context

				for(uint s=0;s<sigma;s++){//for each symbol in the alphabet

					double f = (double)frequencies[i].at(s)/(double)lengths[i];

					if(f>0)
						H0 += -f*log2(f);

				}

				Hk += H0*((double)lengths[i]/(double)n);

			}
		}

	}